

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<7>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint *puVar1;
  uint *puVar2;
  int i;
  int index;
  
  for (index = 0; index < *field; index = index + 1) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    puVar2 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
    puVar1 = (uint *)output->ptr;
    *puVar1 = *puVar2;
    output->ptr = (uint8 *)(puVar1 + 1);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }